

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int map_set_key_size_function(map *map,map_key_size_function_t function)

{
  map_key_size_function_t function_local;
  map *map_local;
  
  if (map->bucket_count == 0) {
    map->key_size_function = function;
    map_local._4_4_ = 0;
  }
  else {
    map_local._4_4_ = -1;
  }
  return map_local._4_4_;
}

Assistant:

int map_set_key_size_function(struct map *map, map_key_size_function_t function)
{
        if (map->bucket_count > 0) {
                // Since we have already added entries to the map we can't
                // change how we determine key size.
                return -1;
        }

        map->key_size_function = function;

        return 0;
}